

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator%(unsigned_short lhs,SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs
         )

{
  bool bVar1;
  char in_SIL;
  unsigned_short in_DI;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
  *in_stack_ffffffffffffffe8;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_stack_fffffffffffffff0;
  unsigned_short local_4;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1;
  
  local_4 = in_DI;
  local_2.m_int = in_SIL;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_1);
  bVar1 = ModulusSimpleCaseHelper<char,_unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::ModulusSimpleCase(local_4,local_2,&local_1);
  if (!bVar1) {
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &stack0xfffffffffffffff6,&local_4);
    SafeInt::operator_cast_to_char(in_stack_fffffffffffffff0);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
              (in_stack_ffffffffffffffe8,'\0');
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  }
  return (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_1.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}